

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

int need_value(FuncState *fs,int list)

{
  uint *puVar1;
  uint *puVar2;
  
  if (list != -1) {
    do {
      puVar1 = fs->f->code + list;
      puVar2 = puVar1;
      if ((0 < list) && (("\b\v\v\n\n\b\b\b\b\b"[puVar1[-1] & 0x7f] & 0x10) != 0)) {
        puVar2 = puVar1 + -1;
      }
      if ((*puVar2 & 0x7f) != 0x43) {
        return 1;
      }
      list = list + -0xfffffe + (*puVar1 >> 7);
      if (*puVar1 >> 7 == 0xfffffe) {
        list = -1;
      }
    } while (list != -1);
  }
  return 0;
}

Assistant:

static int need_value (FuncState *fs, int list) {
  for (; list != NO_JUMP; list = getjump(fs, list)) {
    Instruction i = *getjumpcontrol(fs, list);
    if (GET_OPCODE(i) != OP_TESTSET) return 1;
  }
  return 0;  /* not found */
}